

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.h
# Opt level: O2

void iDynTree::printVectorDifference<iDynTree::Position,iDynTree::Position>
               (string *name,Position *vec1,Position *vec2)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  uint i;
  long lVar4;
  double dVar5;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)name);
  std::operator<<(poVar3," : \n");
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       ((vec1->super_Vector3).m_data[lVar4] - (vec2->super_Vector3).m_data[lVar4]);
    std::operator<<(poVar3," ( ");
    dVar1 = (vec1->super_Vector3).m_data[lVar4];
    dVar2 = (vec2->super_Vector3).m_data[lVar4];
    dVar5 = dVar2;
    if (dVar2 <= dVar1) {
      dVar5 = dVar1;
    }
    poVar3 = std::ostream::_M_insert<double>((dVar1 - dVar2) / dVar5);
    poVar3 = std::operator<<(poVar3," ) ");
    std::operator<<(poVar3,"\n");
  }
  return;
}

Assistant:

void printVectorDifference(std::string name, const VectorType1& vec1, const VectorType2& vec2)
    {
        std::cerr << name << " : \n";
        size_t minSize = vec1.size();

        if( vec2.size() < minSize )
        {
            minSize = vec2.size();
        }

        for(unsigned int i=0; i < minSize; i++ )
        {
            std::cerr << vec1(i) - vec2(i) << " ( " << (vec1(i) - vec2(i))/std::max(vec1(i),vec2(i)) << " ) " << "\n";
        }
    }